

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS
ref_shard_pair(REF_SHARD ref_shard,REF_BOOL *again,REF_INT a0,REF_INT a1,REF_INT b0,REF_INT b1)

{
  REF_SHARD ref_shard_00;
  REF_BOOL *pRVar1;
  uint uVar2;
  REF_BOOL b_marked;
  REF_BOOL a_marked;
  int local_48;
  int local_44;
  REF_SHARD local_40;
  REF_BOOL *local_38;
  
  local_38 = again;
  uVar2 = ref_shard_marked(ref_shard,a0,a1,&local_44);
  pRVar1 = local_38;
  if (uVar2 == 0) {
    local_40 = ref_shard;
    uVar2 = ref_shard_marked(ref_shard,b0,b1,&local_48);
    ref_shard_00 = local_40;
    if (uVar2 == 0) {
      if (local_44 != local_48) {
        *pRVar1 = 1;
        uVar2 = ref_shard_mark_to_split(local_40,a0,a1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0xdb,"ref_shard_pair",(ulong)uVar2,"mark a0-a1");
          return uVar2;
        }
        uVar2 = ref_shard_mark_to_split(ref_shard_00,b0,b1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0xdc,"ref_shard_pair",(ulong)uVar2,"mark b0-b1");
          return uVar2;
        }
      }
      uVar2 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xd8,
             "ref_shard_pair",(ulong)uVar2,"marked? b0-b1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xd7,
           "ref_shard_pair",(ulong)uVar2,"marked? a0-a1");
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_pair(REF_SHARD ref_shard, REF_BOOL *again,
                                         REF_INT a0, REF_INT a1, REF_INT b0,
                                         REF_INT b1) {
  REF_BOOL a_marked, b_marked;

  RSS(ref_shard_marked(ref_shard, a0, a1, &a_marked), "marked? a0-a1");
  RSS(ref_shard_marked(ref_shard, b0, b1, &b_marked), "marked? b0-b1");
  if (a_marked != b_marked) {
    *again = REF_TRUE;
    RSS(ref_shard_mark_to_split(ref_shard, a0, a1), "mark a0-a1");
    RSS(ref_shard_mark_to_split(ref_shard, b0, b1), "mark b0-b1");
  }

  return REF_SUCCESS;
}